

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O0

void __thiscall http::Page::ParseArg(Page *this,char *arg,char **name,char **value)

{
  char **value_local;
  char **name_local;
  char *arg_local;
  Page *this_local;
  
  *name = arg;
  name_local = (char **)arg;
  while( true ) {
    if (*(char *)name_local == '\0') {
      return;
    }
    if (*(char *)name_local == '=') break;
    name_local = (char **)((long)name_local + 1);
  }
  *(undefined1 *)name_local = 0;
  *value = (char *)((long)name_local + 1);
  return;
}

Assistant:

void http::Page::ParseArg(char* arg, char** name, char** value)
{
    *name = arg;
    while (*arg)
    {
        if (*arg == '=')
        {
            *arg = 0;
            *value = ++arg;
            break;
        }
        arg++;
    }
}